

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting_window.cpp
# Opt level: O1

Am_Object Am_Script_Window_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Object *pAVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List *pAVar5;
  Am_Constraint *pAVar6;
  Am_Value_List *pAVar7;
  Am_Object *pAVar8;
  Am_Object_Data *in_RDI;
  Am_Object sg;
  Am_Value_List l;
  Am_Value_List AStack_258;
  Am_Object local_248;
  Am_Value_List local_240;
  Am_Object local_230;
  Am_Object local_228;
  Am_Object local_220;
  Am_Object local_218;
  Am_Object local_210;
  Am_Object local_208;
  Am_Object local_200;
  Am_Formula local_1f8;
  Am_Formula local_1e8;
  Am_Formula local_1d8;
  Am_Formula local_1c8;
  Am_Formula local_1b8;
  Am_Formula local_1a8;
  Am_Formula local_198;
  Am_Formula local_188;
  Am_Formula local_178;
  Am_Formula local_168;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Value local_138;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Value local_110;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Formula local_e8;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Object_Data *local_48;
  Am_Value_List local_40;
  
  local_48 = in_RDI;
  Am_Value_List::Am_Value_List(&local_40);
  Am_Object::Create((Am_Object *)&local_168,(char *)&Am_Command);
  pAVar2 = Am_Object::Set((Am_Object *)&local_168,0x150,"File",0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,true,0);
  Am_Value_List::Am_Value_List(&AStack_258);
  Am_Object::Create((Am_Object *)&local_178,(char *)&Am_Standard_OK_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_178,0x154,-1,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_script_ok.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar5 = Am_Value_List::Add(&AStack_258,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_188,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_188,0x150,"Cancel",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,script_window_cancel.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_198,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_198,0x150,"Remove Script",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&ok_to_remove_formula);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_script_remove.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1a8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_1a8,0x150,"Execute Script",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_script_execute.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1b8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_1b8,0x150,"Select Members",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_script_select_members.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1c8,(char *)&Am_Menu_Line_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_1c8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1d8,(char *)&Am_About_Amulet_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_1d8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar2);
  pAVar5 = Am_Value_List::Add(&local_40,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1e8,(char *)&Am_Command);
  pAVar2 = Am_Object::Set((Am_Object *)&local_1e8,0x150,"Edit",0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,true,0);
  Am_Value_List::Am_Value_List(&local_240);
  Am_Object::Create((Am_Object *)&local_1f8,(char *)&Am_Undo_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_1f8);
  pAVar7 = Am_Value_List::Add(&local_240,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_e8,(char *)&Am_Redo_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_e8);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_110,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_110,0x150,"Cut",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_138,(char *)&Am_Command);
  pAVar3 = Am_Object::Set((Am_Object *)&local_138,0x150,"Copy",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_248,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_248,0x150,"Paste",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_200,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_200,0x150,"Insert Commands Before",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&am_insert_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_insert_commands_before.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x146,am_edit_commands_list_undo.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x147,am_edit_commands_list_undo.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_208,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_208,0x150,"Insert Commands After",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&am_insert_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_insert_commands_after.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x146,am_edit_commands_list_undo.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x147,am_edit_commands_list_undo.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_210,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_210,0x150,"Delete Commands",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&am_delete_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_delete_script_commands.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x146,am_edit_commands_list_undo.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x147,am_edit_commands_list_undo.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_218,(char *)&Am_Menu_Line_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_218);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_220,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_220,0x150,"Generalize",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&am_generalize_script_active);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,am_do_generalize_script.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_228,(char *)&Am_Menu_Line_Command);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_228);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_230,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_230,0x150,"How Invoked...",0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pop_up_invoke_options.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar2);
  Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::~Am_Object(&local_230);
  Am_Object::~Am_Object(&local_228);
  Am_Object::~Am_Object(&local_220);
  Am_Object::~Am_Object(&local_218);
  Am_Object::~Am_Object(&local_210);
  Am_Object::~Am_Object(&local_208);
  Am_Object::~Am_Object(&local_200);
  Am_Object::~Am_Object(&local_248);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::~Am_Object((Am_Object *)&local_110);
  Am_Object::~Am_Object((Am_Object *)&local_e8);
  Am_Object::~Am_Object((Am_Object *)&local_1f8);
  Am_Value_List::~Am_Value_List(&local_240);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  Am_Object::~Am_Object((Am_Object *)&local_1d8);
  Am_Object::~Am_Object((Am_Object *)&local_1c8);
  Am_Object::~Am_Object((Am_Object *)&local_1b8);
  Am_Object::~Am_Object((Am_Object *)&local_1a8);
  Am_Object::~Am_Object((Am_Object *)&local_198);
  Am_Object::~Am_Object((Am_Object *)&local_188);
  Am_Object::~Am_Object((Am_Object *)&local_178);
  Am_Value_List::~Am_Value_List(&AStack_258);
  Am_Object::~Am_Object((Am_Object *)&local_168);
  Am_Object::Create((Am_Object *)&AStack_258,(char *)&Am_Window);
  pAVar2 = Am_Object::Set((Am_Object *)&AStack_258,0x89,script_window_destroy_method.from_wrapper,0)
  ;
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"Script for Commands",0);
  pAVar2 = Am_Object::Set(pAVar2,0x6d,"Script Commands",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x212,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,400,0);
  pAVar2 = Am_Object::Set(pAVar2,0x69,false,0);
  AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  pAVar2 = Am_Object::Add(pAVar2,AVar1,pAVar4,0);
  AVar1 = Am_SHOW_SCRIPT_COMMAND;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  pAVar2 = Am_Object::Add(pAVar2,AVar1,pAVar4,0);
  Am_Object::Create((Am_Object *)&local_240,(char *)&Am_Multiple_Undo_Object);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_240);
  pAVar2 = Am_Object::Set(pAVar2,0x174,pAVar4,0);
  Am_Object::operator=(&Am_Script_Window,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_240);
  Am_Object::~Am_Object((Am_Object *)&AStack_258);
  AVar1 = Am_UNDO_MENU_BAR;
  local_248.data = (Am_Object_Data *)0x0;
  Am_Object::Create(&local_200,(char *)&Am_Menu_Bar);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(&local_200,0x6a,pAVar4,0);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  Am_Object::Am_Object(&local_58,pAVar2);
  pAVar2 = Am_Object::Add_Part(&Am_Script_Window,AVar1,&local_58,0);
  Am_Object::Create(&local_208,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_208,100,4,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&AStack_258,(uint)Am_UNDO_MENU_BAR,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&AStack_258);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0xd2,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0x13,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Script Editor",0);
  Am_Font::Am_Font((Am_Font *)&local_210,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_210);
  pAVar3 = Am_Object::Set(pAVar3,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_60,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x150,&local_60,0);
  AVar1 = Am_NAME_OBJECT;
  Am_Object::Create(&local_228,(char *)&Am_Text_Input_Widget);
  Am_Font::Am_Font((Am_Font *)&local_230,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_230);
  pAVar3 = Am_Object::Set(&local_228,0xac,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,100,10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_240,0x150,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_240);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0xd4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0x19,0);
  Am_Object::Get_Object(&local_220,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_220,0x150,"Script Name:",0);
  Am_Object::Get_Object(&local_218,(Am_Slot_Key)pAVar3,10);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(&local_218,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_68,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_68,0);
  Am_Object::Create(&local_88,(char *)&Am_Button);
  pAVar3 = Am_Object::Set(&local_88,0x1c7,false,0);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_168,(uint)Am_NAME_OBJECT,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_168);
  pAVar3 = Am_Object::Set(pAVar3,100,pAVar6,0);
  Am_From_Sibling((Am_Slot_Key)&local_178,Am_NAME_OBJECT);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_178);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  Am_Object::Get_Object(&local_80,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_80,0x150,"How Invoked...",0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pop_up_invoke_options.from_wrapper,0);
  Am_Object::Get_Object(&local_78,(Am_Slot_Key)pAVar3,10);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(&local_78,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_70,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x152,&local_70,0);
  Am_Object::Create(&local_98,(char *)&Am_Text);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_188,0x152,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_188);
  pAVar3 = Am_Object::Set(&local_98,100,pAVar6,0);
  Am_From_Sibling((Am_Slot_Key)&local_198,Am_NAME_OBJECT);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_198);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&gen_how_invoke_text);
  pAVar3 = Am_Object::Set(pAVar3,0xab,pAVar6,0);
  Am_Object::Am_Object(&local_90,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_90,true,0);
  Am_Object::Create(&local_a8,(char *)&Am_Border_Rectangle);
  pAVar3 = Am_Object::Set(&local_a8,100,10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_1a8,0x152,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1a8);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  Am_From_Owner((Am_Slot_Key)&local_1b8,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1b8);
  pAVar3 = Am_Object::Set(pAVar3,0x66,pAVar6,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_1c8,(uint)Am_UNDO_OPTIONS);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1c8);
  pAVar3 = Am_Object::Set(pAVar3,0x67,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x172,0,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_a0,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_a0,true,0);
  Am_Object::Create(&local_b8,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_b8,100,0x10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_1d8,0x152,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1d8);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Commands:",0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar4,0);
  Am_Object::Am_Object(&local_b0,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x151,&local_b0,0);
  AVar1 = Am_UNDO_SCROLL_GROUP;
  Am_Object::Create(&local_d8,(char *)&Am_Scrolling_Menu);
  pAVar3 = Am_Object::Set(&local_d8,100,0x12,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_1e8,0x151,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1e8);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  Am_From_Owner((Am_Slot_Key)&local_1f8,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1f8);
  pAVar3 = Am_Object::Set(pAVar3,0x66,pAVar6,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_e8,(uint)Am_UNDO_OPTIONS);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&local_e8);
  pAVar3 = Am_Object::Set(pAVar3,0x67,pAVar6,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x18a,true,0);
  Am_Object::Get_Object(&local_d0,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_d0,0x154,-1,0);
  Am_Object::Get_Object(&local_c8,(Am_Slot_Key)pAVar3,10);
  Am_Object::Create(&local_100,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_4c,"left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value(&local_4c);
  pAVar3 = Am_Object::Set(&local_100,0xb9,&local_110,0);
  pAVar3 = Am_Object::Set(pAVar3,0xcd,10.0,0);
  pAVar3 = Am_Object::Set(pAVar3,0xba,am_on_selectable_line_part.from_wrapper,0);
  Am_Object::Get_Object(&local_f8,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_f8,0xca,am_select_line_part.from_wrapper,0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  Am_Object::Get_Object(&local_f0,(Am_Slot_Key)pAVar3,10);
  pAVar3 = Am_Object::Add_Part(&local_c8,0x1ac,&local_f0,0);
  Am_Object::Create(&local_128,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_50,"double_left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value(&local_50);
  pAVar8 = Am_Object::Set(&local_128,0xb9,&local_138,0);
  pAVar8 = Am_Object::Set(pAVar8,0xcd,10.0,0);
  pAVar8 = Am_Object::Set(pAVar8,0xba,am_on_selectable_line_part.from_wrapper,0);
  Am_Object::Get_Object(&local_120,(Am_Slot_Key)pAVar8,0xc5);
  pAVar8 = Am_Object::Set(&local_120,0xca,am_generalize_script_double_click.from_wrapper,0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  Am_Object::Get_Object(&local_118,(Am_Slot_Key)pAVar8,10);
  pAVar3 = Am_Object::Add_Part(pAVar3,0x1b8,&local_118,0);
  pAVar3 = Am_Object::operator=(&local_248,pAVar3);
  Am_Object::Am_Object(&local_c0,pAVar3);
  Am_Object::Add_Part(pAVar2,AVar1,&local_c0,0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_120);
  Am_Value::~Am_Value(&local_138);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_f8);
  Am_Value::~Am_Value(&local_110);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_d0);
  Am_Formula::~Am_Formula(&local_e8);
  Am_Formula::~Am_Formula(&local_1f8);
  Am_Formula::~Am_Formula(&local_1e8);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_b0);
  Am_Formula::~Am_Formula(&local_1d8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_a0);
  Am_Formula::~Am_Formula(&local_1c8);
  Am_Formula::~Am_Formula(&local_1b8);
  Am_Formula::~Am_Formula(&local_1a8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_90);
  Am_Formula::~Am_Formula(&local_198);
  Am_Formula::~Am_Formula(&local_188);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_80);
  Am_Formula::~Am_Formula(&local_178);
  Am_Formula::~Am_Formula(&local_168);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_218);
  Am_Object::~Am_Object(&local_220);
  Am_Formula::~Am_Formula((Am_Formula *)&local_240);
  Am_Font::~Am_Font((Am_Font *)&local_230);
  Am_Object::~Am_Object(&local_228);
  Am_Object::~Am_Object(&local_60);
  Am_Font::~Am_Font((Am_Font *)&local_210);
  Am_Formula::~Am_Formula((Am_Formula *)&AStack_258);
  Am_Object::~Am_Object(&local_208);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_200);
  Am_Object::Get_Object((Am_Object *)&local_240,(Am_Slot_Key)&local_248,0x1d2);
  pAVar2 = Am_Object::Set((Am_Object *)&local_240,0x96,-4,0);
  Am_Object::Get_Object((Am_Object *)&AStack_258,(Am_Slot_Key)pAVar2,0xa5);
  Am_Object::Set((Am_Object *)&AStack_258,0x84,false,0);
  Am_Object::~Am_Object((Am_Object *)&AStack_258);
  Am_Object::~Am_Object((Am_Object *)&local_240);
  Am_Object::Get_Object((Am_Object *)&AStack_258,(Am_Slot_Key)&local_248,0xc5);
  Am_Object::Set((Am_Object *)&AStack_258,0xca,am_clear_select_line_part.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&AStack_258);
  pAVar2 = Am_Object::Set(&Am_Script_Window,0xa1,0x1e,0);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create((Am_Object *)&local_168,(char *)&Am_Button_Panel);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar3 = Am_Object::Set((Am_Object *)&local_168,100,pAVar6,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Bottom_Is_Bottom_Of_Owner);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,5,0);
  pAVar3 = Am_Object::Set(pAVar3,0x99,false,0);
  Am_Value_List::Am_Value_List(&AStack_258);
  Am_Object::Create((Am_Object *)&local_178,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_178,0x150,"OK",0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,am_script_ok.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(&AStack_258,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_188,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_188,0x150,"Cancel",0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,script_window_cancel.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_198,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_198,0x150,"Remove",0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(&ok_to_remove_formula);
  pAVar8 = Am_Object::Set(pAVar8,0xcc,pAVar6,0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,am_script_remove.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1a8,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_1a8,0x150,"Execute",0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,am_script_execute.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1b8,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_1b8,0x150,"Step",0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,am_execute_script_step_one.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_1c8,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_1c8,0x150,"Select Members",0);
  pAVar8 = Am_Object::Set(pAVar8,0x154,-1,0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,am_script_select_members.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar5 = Am_Value_List::Add(pAVar5,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar4,0);
  Am_Object::Am_Object(&local_140,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_140,0);
  AVar1 = Am_EXECUTE_COUNTER;
  Am_Object::Create((Am_Object *)&local_1d8,(char *)&Am_Number_Input_Widget);
  pAVar3 = Am_Object::Set((Am_Object *)&local_1d8,100,200,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_240,(uint)Am_UNDO_OPTIONS,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_240);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar6,0);
  pAVar3 = Am_Object::Set(pAVar3,0x169,0,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar4,0);
  Am_Object::Create((Am_Object *)&local_1e8,(char *)&Am_Command);
  pAVar8 = Am_Object::Set((Am_Object *)&local_1e8,0x150,"Count",0);
  pAVar8 = Am_Object::Set(pAVar8,0xca,count_set.from_wrapper,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar3 = Am_Object::Set(pAVar3,0xc5,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0x50,0);
  pAVar3 = Am_Object::Set(pAVar3,0x169,1,0);
  Am_Object::Am_Object(&local_148,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_148,0);
  Am_Object::Create((Am_Object *)&local_1f8,(char *)&Am_One_Shot_Interactor);
  pAVar3 = Am_Object::Set((Am_Object *)&local_1f8,0xb9,"Control_u",0);
  pAVar3 = Am_Object::Set(pAVar3,0xca,increment_counter.from_wrapper,0);
  Am_Object::Am_Object(&local_150,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_150,true,0);
  Am_Object::Create(&local_158,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(pAVar2,&local_158,true,0);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object((Am_Object *)&local_1f8);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object((Am_Object *)&local_1e8);
  Am_Formula::~Am_Formula((Am_Formula *)&local_240);
  Am_Object::~Am_Object((Am_Object *)&local_1d8);
  Am_Object::~Am_Object(&local_140);
  Am_Object::~Am_Object((Am_Object *)&local_1c8);
  Am_Object::~Am_Object((Am_Object *)&local_1b8);
  Am_Object::~Am_Object((Am_Object *)&local_1a8);
  Am_Object::~Am_Object((Am_Object *)&local_198);
  Am_Object::~Am_Object((Am_Object *)&local_188);
  Am_Object::~Am_Object((Am_Object *)&local_178);
  Am_Value_List::~Am_Value_List(&AStack_258);
  Am_Object::~Am_Object((Am_Object *)&local_168);
  Am_Object::Am_Object((Am_Object *)local_48,&Am_Script_Window);
  Am_Object::~Am_Object(&local_248);
  Am_Value_List::~Am_Value_List(&local_40);
  return (Am_Object)local_48;
}

Assistant:

Am_Object
Am_Script_Window_Initialize()
{
  Am_Value_List l;
  l.Add(Am_Command.Create(DSTR("File"))
            .Set(Am_LABEL, "File")
            .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
            .Set(Am_ITEMS,
                 Am_Value_List()
                     .Add(Am_Standard_OK_Command.Create()
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_ok))
                     .Add(Am_Command.Create(DSTR("Cancel"))
                              .Set(Am_LABEL, "Cancel")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, script_window_cancel))
                     .Add(Am_Command.Create(DSTR("Remove"))
                              .Set(Am_LABEL, "Remove Script")
                              .Set(Am_ACTIVE, ok_to_remove_formula)
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_remove))
                     .Add(Am_Command.Create(DSTR("Execute"))
                              .Set(Am_LABEL, "Execute Script")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_execute))
                     .Add(Am_Command.Create(DSTR("select_members"))
                              .Set(Am_LABEL, "Select Members")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_select_members))
                     .Add(Am_Menu_Line_Command.Create())
                     .Add(Am_About_Amulet_Command.Create())))
      .Add(
          Am_Command.Create(DSTR("Edit_Command"))
              .Set(Am_LABEL, "Edit")
              .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
              .Set(
                  Am_ITEMS,
                  Am_Value_List()
                      .Add(Am_Undo_Command.Create())
                      .Add(Am_Redo_Command.Create())
                      .Add(Am_Command.Create(DSTR("Cut"))
                               .Set(Am_LABEL, "Cut")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Copy"))
                               .Set(Am_LABEL, "Copy")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Paste"))
                               .Set(Am_LABEL, "Paste")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Insert Commands Before"))
                               .Set(Am_LABEL, "Insert Commands Before")
                               .Set(Am_ACTIVE, am_insert_commands_ok)
                               .Set(Am_DO_METHOD, am_insert_commands_before)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Command.Create(DSTR("Insert Commands After"))
                               .Set(Am_LABEL, "Insert Commands After")
                               .Set(Am_ACTIVE, am_insert_commands_ok)
                               .Set(Am_DO_METHOD, am_insert_commands_after)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Command.Create(DSTR("Delete"))
                               .Set(Am_LABEL, "Delete Commands")
                               .Set(Am_ACTIVE, am_delete_commands_ok)
                               .Set(Am_DO_METHOD, am_delete_script_commands)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Menu_Line_Command.Create())
                      .Add(Am_Command.Create(DSTR("Generalize"))
                               .Set(Am_LABEL, "Generalize")
                               .Set(Am_ACTIVE, am_generalize_script_active)
                               .Set(Am_DO_METHOD, am_do_generalize_script))
                      .Add(Am_Menu_Line_Command.Create())
                      .Add(Am_Command.Create(DSTR("Invoke"))
                               .Set(Am_LABEL, "How Invoked...")
                               .Set(Am_DO_METHOD, pop_up_invoke_options))));
  Am_Script_Window =
      Am_Window.Create(DSTR("Am_Script_Window"))
          .Set(Am_DESTROY_WINDOW_METHOD, script_window_destroy_method)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_TITLE, "Script for Commands")
          .Set(Am_ICON_TITLE, "Script Commands")
          .Set(Am_WIDTH, 530)
          .Set(Am_HEIGHT, 400)
          .Set(Am_VISIBLE, false)
          .Add(Am_SCRIPT_EXECUTE_COMMAND, Am_No_Object)
          .Add(Am_SHOW_SCRIPT_COMMAND, Am_No_Object)
          //undo operations in undo window!  weird
          .Set(Am_UNDO_HANDLER, Am_Multiple_Undo_Object.Create());
  Am_Object sg;
  Am_Script_Window
      .Add_Part(Am_UNDO_MENU_BAR, Am_Menu_Bar.Create()
                                      .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                      .Set(Am_ITEMS, l))
      .Add_Part(Am_LABEL,
                Am_Text.Create()
                    .Set(Am_LEFT, 4)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_UNDO_MENU_BAR, 5))
                    .Set(Am_WIDTH, 210)
                    .Set(Am_HEIGHT, 19)
                    .Set(Am_TEXT, "Script Editor")
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true, false, false,
                                          Am_FONT_LARGE))
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_NAME_OBJECT,
                Am_Text_Input_Widget.Create()
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                    .Set(Am_LEFT, 10)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_LABEL, 5))
                    .Set(Am_WIDTH, 212)
                    .Set(Am_HEIGHT, 25)
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "Script Name:")
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_ACCELERATOR,
                Am_Button.Create(DSTR("popup how invoke"))
                    .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_NAME_OBJECT, 35))
                    .Set(Am_TOP, Am_From_Sibling(Am_NAME_OBJECT, Am_TOP))
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "How Invoked...")
                    .Set(Am_DO_METHOD, pop_up_invoke_options)
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_Text.Create(DSTR("invoke_feedback"))
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_ACCELERATOR, 8))
                    .Set(Am_TOP, Am_From_Sibling(Am_NAME_OBJECT, Am_TOP))
                    .Set(Am_TEXT, gen_how_invoke_text))
      .Add_Part(Am_Border_Rectangle.Create()
                    .Set(Am_LEFT, 10)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_ACCELERATOR, 5))
                    .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -20))
                    .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 6))
                    .Set(Am_SELECTED, 0)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_SHORT_LABEL,
                Am_Text.Create()
                    .Set(Am_LEFT, 16)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_ACCELERATOR, 8))
                    .Set(Am_TEXT, "Commands:")
                    .Set(Am_LINE_STYLE, Am_Black))
      .Add_Part(
          Am_UNDO_SCROLL_GROUP,
          sg =
              Am_Scrolling_Menu.Create(DSTR("cmds_in_script"))
                  .Set(Am_LEFT, 18)
                  .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_SHORT_LABEL, 3))
                  .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -34))
                  .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 15))
                  .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                  .Set(Am_H_SCROLL_BAR, true)
                  .Get_Object(Am_COMMAND)
                  .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                  .Get_Owner()
                  .Add_Part(
                      Am_INTERACTOR,
                      Am_One_Shot_Interactor.Create(DSTR("select_line_part"))
                          .Set(Am_START_WHEN, Am_Input_Char("left_down"))
                          .Set(Am_PRIORITY, 10.0)
                          .Set(Am_START_WHERE_TEST, am_on_selectable_line_part)
                          .Get_Object(Am_COMMAND)
                          .Set(Am_DO_METHOD, am_select_line_part)
                          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                          .Get_Owner())
                  .Add_Part(
                      Am_ARROW_INTERACTOR,
                      Am_One_Shot_Interactor.Create(DSTR("double_clk"))
                          .Set(Am_START_WHEN, Am_Input_Char("double_left_down"))
                          .Set(Am_PRIORITY, 10.0)
                          .Set(Am_START_WHERE_TEST, am_on_selectable_line_part)
                          .Get_Object(Am_COMMAND)
                          .Set(Am_DO_METHOD, am_generalize_script_double_click)
                          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                          .Get_Owner()));
  sg.Get_Object(Am_SUB_MENU)
      .Set(Am_V_SPACING, -4)
      .Get_Object(Am_ITEM_PROTOTYPE)
      .Set(Am_PRETEND_TO_BE_LEAF, false);
  sg.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, am_clear_select_line_part);
  Am_Script_Window.Set(Am_BOTTOM_OFFSET, 30)
      .Add_Part(
          Am_UNDO_OPTIONS,
          Am_Button_Panel.Create()
              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
              .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
              .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
              .Set(Am_LAYOUT, Am_Horizontal_Layout)
              .Set(Am_H_SPACING, 5)
              .Set(Am_FIXED_WIDTH, false)
              .Set(Am_ITEMS,
                   Am_Value_List()
                       .Add(Am_Command.Create(DSTR("OK-menu"))
                                .Set(Am_LABEL, "OK")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_ok))
                       .Add(Am_Command.Create(DSTR("Cancel"))
                                .Set(Am_LABEL, "Cancel")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, script_window_cancel))
                       .Add(Am_Command.Create(DSTR("Remove"))
                                .Set(Am_LABEL, "Remove")
                                .Set(Am_ACTIVE, ok_to_remove_formula)
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_remove))
                       .Add(Am_Command.Create(DSTR("Execute"))
                                .Set(Am_LABEL, "Execute")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_execute))
                       .Add(Am_Command.Create(DSTR("Step"))
                                .Set(Am_LABEL, "Step")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_execute_script_step_one))
                       .Add(Am_Command.Create(DSTR("select_members"))
                                .Set(Am_LABEL, "Select Members")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_select_members))))
      .Add_Part(Am_EXECUTE_COUNTER,
                Am_Number_Input_Widget.Create()
                    .Set(Am_LEFT, 200)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_UNDO_OPTIONS, 2))
                    .Set(Am_VALUE, 0)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                    .Set(Am_COMMAND, Am_Command.Create()
                                         .Set(Am_LABEL, "Count")
                                         .Set(Am_DO_METHOD, count_set))
                    .Set(Am_WIDTH, 80)
                    .Set(Am_VALUE, 1))
      .Add_Part(Am_One_Shot_Interactor.Create(DSTR("incrementer"))
                    .Set(Am_START_WHEN, "Control_u")
                    .Set(Am_DO_METHOD, increment_counter))
      .Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());
  return Am_Script_Window;
}